

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

bool __thiscall iDynTree::XMLParser::parseXMLFile(XMLParser *this,string *absoluteFileName)

{
  bool bVar1;
  int iVar2;
  pointer pXVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  xmlSAXHandlerPtr pxVar8;
  undefined8 in_RDI;
  int result;
  string message;
  int validation;
  xmlSchemaValidCtxtPtr validator;
  xmlSchemaPtr xmlSchema;
  xmlSchemaParserCtxtPtr schemaParserContext;
  XMLParserState *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  XMLParserState *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  byte local_1;
  
  xmlCheckVersion(0x51b1);
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x128e0d);
  XMLParserState::resetState(in_stack_ffffffffffffff00);
  pXVar3 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x128e26);
  if ((pXVar3->m_performValidation & 1U) != 0) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x128e3d);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      iDynTree::reportError
                ("XMLParser","parseXMLFile","Validation requested, but no schema has been specified"
                );
      local_1 = 0;
      goto LAB_0012911b;
    }
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x128e83);
    uVar5 = std::__cxx11::string::c_str();
    local_20 = xmlSchemaNewParserCtxt(uVar5);
    local_28 = xmlSchemaParse(local_20);
    uVar5 = xmlSchemaNewValidCtxt(local_28);
    local_30 = uVar5;
    uVar6 = std::__cxx11::string::c_str();
    local_34 = xmlSchemaValidateFile(uVar5,uVar6,0);
    xmlSchemaFreeValidCtxt(local_30);
    xmlSchemaFree(local_28);
    xmlSchemaFreeParserCtxt(local_20);
    if (local_34 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (char *)in_stack_ffffffffffffff00);
      std::
      unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
      ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                    *)0x128f90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("XMLParser","parseXMLFile",pcVar7);
      local_1 = 0;
      std::__cxx11::string::~string(local_58);
      goto LAB_0012911b;
    }
  }
  pXVar3 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x1290b5);
  pxVar8 = XMLParserPimpl::callbackHandler(pXVar3);
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = xmlSAXUserParseFile(pxVar8,in_RDI,uVar5);
  local_1 = 0;
  if (iVar2 == 0) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x1290f9);
    bVar1 = XMLParserState::getParsingErrorState(in_stack_ffffffffffffff10);
    local_1 = bVar1 ^ 0xff;
  }
  local_1 = local_1 & 1;
LAB_0012911b:
  return (bool)(local_1 & 1);
}

Assistant:

bool XMLParser::parseXMLFile(std::string absoluteFileName)
    {
        assert(m_pimpl);
        LIBXML_TEST_VERSION

        // Reset the failure state.
        m_pimpl->m_parserState.resetState();
        
        if (m_pimpl->m_performValidation) {
            if (m_pimpl->m_schemaLocation.empty()) {
                reportError("XMLParser", "parseXMLFile", "Validation requested, but no schema has been specified");
                return false;
            }
            // Create necessary structures for the validator
            xmlSchemaParserCtxtPtr schemaParserContext = xmlSchemaNewParserCtxt(m_pimpl->m_schemaLocation.c_str());
            xmlSchemaPtr xmlSchema = xmlSchemaParse(schemaParserContext);
            xmlSchemaValidCtxtPtr validator = xmlSchemaNewValidCtxt(xmlSchema);
            
            // This is the actual validation. Note that there is the possibility to use
            // xmlSchemaSAXPlug which should perform the validation while parsing.
            // The code remains cleared in this way though, as the validation is optional.

            int validation = xmlSchemaValidateFile(validator, absoluteFileName.c_str(), 0);

            xmlSchemaFreeValidCtxt(validator);
            xmlSchemaFree(xmlSchema);
            xmlSchemaFreeParserCtxt(schemaParserContext);
            if (validation) {
                std::string message = std::string("Failed to validate ") + absoluteFileName + " for schema " + m_pimpl->m_schemaLocation;
                reportError("XMLParser", "parseXMLFile", message.c_str());
                return false;
            }
    
        }

//        xmlParserCtxtPtr parserContext = xmlCreatePushParserCtxt(m_pimpl->callbackHandler(),
//                                                                 this, NULL, 0, absoluteFileName.c_str());

        int result = xmlSAXUserParseFile(m_pimpl->callbackHandler(), this, absoluteFileName.c_str());
        return result == 0 && !m_pimpl->m_parserState.getParsingErrorState();
    }